

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QKmsPlane>::emplace<QKmsPlane_const&>
          (QGenericArrayOps<QKmsPlane> *this,qsizetype i,QKmsPlane *args)

{
  QKmsPlane **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  Data *pDVar5;
  uint *puVar6;
  qsizetype qVar7;
  QKmsPlane *pQVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  int *piVar23;
  Type TVar24;
  uint32_t uVar25;
  uint32_t uVar26;
  uint32_t uVar27;
  uint32_t uVar28;
  uint32_t uVar29;
  uint32_t uVar30;
  uint32_t uVar31;
  uint32_t uVar32;
  uint32_t uVar33;
  uint32_t uVar34;
  uint32_t uVar35;
  Rotations RVar36;
  Rotations RVar37;
  uint32_t uVar38;
  uint32_t uVar39;
  long in_FS_OFFSET;
  bool bVar40;
  Inserter local_e0;
  QKmsPlane local_90;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QArrayDataPointer<QKmsPlane>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_001158dc:
    local_90._12_4_ = 0xaaaaaaaa;
    local_90.id = args->id;
    local_90.type = args->type;
    local_90.possibleCrtcs = args->possibleCrtcs;
    pDVar5 = (args->supportedFormats).d.d;
    local_90.supportedFormats.d.d._0_4_ = SUB84(pDVar5,0);
    local_90.supportedFormats.d.d._4_4_ = (undefined4)((ulong)pDVar5 >> 0x20);
    puVar6 = (args->supportedFormats).d.ptr;
    local_90.supportedFormats.d.ptr._0_4_ = SUB84(puVar6,0);
    local_90.supportedFormats.d.ptr._4_4_ = (undefined4)((ulong)puVar6 >> 0x20);
    qVar7 = (args->supportedFormats).d.size;
    local_90.supportedFormats.d.size._0_4_ = (undefined4)qVar7;
    local_90.supportedFormats.d.size._4_4_ = (undefined4)((ulong)qVar7 >> 0x20);
    if (pDVar5 != (Data *)0x0) {
      LOCK();
      (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    uVar9 = args->initialRotation;
    uVar10 = args->availableRotations;
    uVar11 = args->rotationPropertyId;
    uVar12 = args->crtcPropertyId;
    uVar13 = args->framebufferPropertyId;
    uVar14 = args->srcXPropertyId;
    uVar15 = args->srcYPropertyId;
    uVar16 = args->crtcXPropertyId;
    uVar17 = args->crtcYPropertyId;
    uVar18 = args->srcwidthPropertyId;
    uVar19 = args->srcheightPropertyId;
    uVar20 = args->crtcwidthPropertyId;
    uVar21 = args->crtcheightPropertyId;
    uVar22 = args->zposPropertyId;
    local_90.blendOpPropertyId = args->blendOpPropertyId;
    local_90.activeCrtcId = args->activeCrtcId;
    bVar40 = (this->super_QArrayDataPointer<QKmsPlane>).size != 0;
    local_90.initialRotation.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
    super_QFlagsStorage<QKmsPlane::Rotation>.i =
         (QFlagsStorageHelper<QKmsPlane::Rotation,_4>)
         (QFlagsStorageHelper<QKmsPlane::Rotation,_4>)uVar9;
    local_90.availableRotations.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
    super_QFlagsStorage<QKmsPlane::Rotation>.i =
         (QFlagsStorageHelper<QKmsPlane::Rotation,_4>)
         (QFlagsStorageHelper<QKmsPlane::Rotation,_4>)uVar10;
    local_90.rotationPropertyId = uVar11;
    local_90.crtcPropertyId = uVar12;
    local_90.framebufferPropertyId = uVar13;
    local_90.srcXPropertyId = uVar14;
    local_90.srcYPropertyId = uVar15;
    local_90.crtcXPropertyId = uVar16;
    local_90.crtcYPropertyId = uVar17;
    local_90.srcwidthPropertyId = uVar18;
    local_90.srcheightPropertyId = uVar19;
    local_90.crtcwidthPropertyId = uVar20;
    local_90.crtcheightPropertyId = uVar21;
    local_90.zposPropertyId = uVar22;
    QArrayDataPointer<QKmsPlane>::detachAndGrow
              (&this->super_QArrayDataPointer<QKmsPlane>,(uint)(i == 0 && bVar40),1,
               (QKmsPlane **)0x0,(QArrayDataPointer<QKmsPlane> *)0x0);
    if (i == 0 && bVar40) {
      pQVar8 = (this->super_QArrayDataPointer<QKmsPlane>).ptr;
      pQVar8[-1].possibleCrtcs = local_90.possibleCrtcs;
      pQVar8[-1].id = local_90.id;
      pQVar8[-1].type = local_90.type;
      pDVar5 = (Data *)CONCAT44(local_90.supportedFormats.d.d._4_4_,
                                local_90.supportedFormats.d.d._0_4_);
      local_90.supportedFormats.d.d._0_4_ = 0;
      local_90.supportedFormats.d.d._4_4_ = 0;
      pQVar8[-1].supportedFormats.d.d = pDVar5;
      puVar6 = (uint *)CONCAT44(local_90.supportedFormats.d.ptr._4_4_,
                                local_90.supportedFormats.d.ptr._0_4_);
      local_90.supportedFormats.d.ptr._0_4_ = 0;
      local_90.supportedFormats.d.ptr._4_4_ = 0;
      pQVar8[-1].supportedFormats.d.ptr = puVar6;
      qVar7 = CONCAT44(local_90.supportedFormats.d.size._4_4_,
                       (undefined4)local_90.supportedFormats.d.size);
      local_90.supportedFormats.d.size._0_4_ = 0;
      local_90.supportedFormats.d.size._4_4_ = 0;
      pQVar8[-1].supportedFormats.d.size = qVar7;
      pQVar8[-1].initialRotation =
           (Rotations)
           local_90.initialRotation.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
           super_QFlagsStorage<QKmsPlane::Rotation>.i;
      pQVar8[-1].availableRotations =
           (Rotations)
           local_90.availableRotations.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
           super_QFlagsStorage<QKmsPlane::Rotation>.i;
      pQVar8[-1].rotationPropertyId = local_90.rotationPropertyId;
      pQVar8[-1].crtcPropertyId = local_90.crtcPropertyId;
      pQVar8[-1].framebufferPropertyId = local_90.framebufferPropertyId;
      pQVar8[-1].srcXPropertyId = local_90.srcXPropertyId;
      pQVar8[-1].srcYPropertyId = local_90.srcYPropertyId;
      pQVar8[-1].crtcXPropertyId = local_90.crtcXPropertyId;
      pQVar8[-1].crtcYPropertyId = local_90.crtcYPropertyId;
      pQVar8[-1].srcwidthPropertyId = local_90.srcwidthPropertyId;
      pQVar8[-1].srcheightPropertyId = local_90.srcheightPropertyId;
      pQVar8[-1].crtcwidthPropertyId = local_90.crtcwidthPropertyId;
      pQVar8[-1].crtcheightPropertyId = local_90.crtcheightPropertyId;
      pQVar8[-1].zposPropertyId = local_90.zposPropertyId;
      pQVar8[-1].blendOpPropertyId = local_90.blendOpPropertyId;
      pQVar8[-1].activeCrtcId = local_90.activeCrtcId;
      ppQVar1 = &(this->super_QArrayDataPointer<QKmsPlane>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QArrayDataPointer<QKmsPlane>).size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      local_e0.sourceCopyConstruct = 0;
      local_e0.nSource = 0;
      local_e0.move = 0;
      local_e0.sourceCopyAssign = 0;
      local_e0.end = (QKmsPlane *)0x0;
      local_e0.last = (QKmsPlane *)0x0;
      local_e0.where = (QKmsPlane *)0x0;
      local_e0.begin = (this->super_QArrayDataPointer<QKmsPlane>).ptr;
      local_e0.size = (this->super_QArrayDataPointer<QKmsPlane>).size;
      local_e0.data = &this->super_QArrayDataPointer<QKmsPlane>;
      Inserter::insertOne(&local_e0,i,&local_90);
      (local_e0.data)->ptr = local_e0.begin;
      (local_e0.data)->size = local_e0.size;
    }
    piVar23 = (int *)CONCAT44(local_90.supportedFormats.d.d._4_4_,
                              local_90.supportedFormats.d.d._0_4_);
    if (piVar23 != (int *)0x0) {
      LOCK();
      *piVar23 = *piVar23 + -1;
      UNLOCK();
      if (*piVar23 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)
                   CONCAT44(local_90.supportedFormats.d.d._4_4_,local_90.supportedFormats.d.d._0_4_)
                   ,4,0x10);
      }
    }
  }
  else {
    lVar4 = (this->super_QArrayDataPointer<QKmsPlane>).size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc - lVar4 !=
        ((long)((long)(this->super_QArrayDataPointer<QKmsPlane>).ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        0x4ec4ec4ec4ec4ec5)) {
      pQVar8 = (this->super_QArrayDataPointer<QKmsPlane>).ptr;
      pQVar8[lVar4].possibleCrtcs = args->possibleCrtcs;
      TVar24 = args->type;
      pQVar8[lVar4].id = args->id;
      pQVar8[lVar4].type = TVar24;
      pDVar5 = (args->supportedFormats).d.d;
      pQVar8[lVar4].supportedFormats.d.d = pDVar5;
      pQVar8[lVar4].supportedFormats.d.ptr = (args->supportedFormats).d.ptr;
      pQVar8[lVar4].supportedFormats.d.size = (args->supportedFormats).d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      RVar36.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
      super_QFlagsStorage<QKmsPlane::Rotation>.i =
           (args->initialRotation).super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>;
      RVar37.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
      super_QFlagsStorage<QKmsPlane::Rotation>.i =
           (args->availableRotations).super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>;
      uVar38 = args->rotationPropertyId;
      uVar39 = args->crtcPropertyId;
      uVar32 = args->framebufferPropertyId;
      uVar33 = args->srcXPropertyId;
      uVar34 = args->srcYPropertyId;
      uVar35 = args->crtcXPropertyId;
      uVar28 = args->crtcYPropertyId;
      uVar29 = args->srcwidthPropertyId;
      uVar30 = args->srcheightPropertyId;
      uVar31 = args->crtcwidthPropertyId;
      uVar25 = args->zposPropertyId;
      uVar26 = args->blendOpPropertyId;
      uVar27 = args->activeCrtcId;
      pQVar8[lVar4].crtcheightPropertyId = args->crtcheightPropertyId;
      pQVar8[lVar4].zposPropertyId = uVar25;
      pQVar8[lVar4].blendOpPropertyId = uVar26;
      pQVar8[lVar4].activeCrtcId = uVar27;
      pQVar8[lVar4].crtcYPropertyId = uVar28;
      pQVar8[lVar4].srcwidthPropertyId = uVar29;
      pQVar8[lVar4].srcheightPropertyId = uVar30;
      pQVar8[lVar4].crtcwidthPropertyId = uVar31;
      pQVar8[lVar4].framebufferPropertyId = uVar32;
      pQVar8[lVar4].srcXPropertyId = uVar33;
      pQVar8[lVar4].srcYPropertyId = uVar34;
      pQVar8[lVar4].crtcXPropertyId = uVar35;
      pQVar8[lVar4].initialRotation =
           (Rotations)
           RVar36.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
           super_QFlagsStorage<QKmsPlane::Rotation>.i;
      pQVar8[lVar4].availableRotations =
           (Rotations)
           RVar37.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
           super_QFlagsStorage<QKmsPlane::Rotation>.i;
      pQVar8[lVar4].rotationPropertyId = uVar38;
      pQVar8[lVar4].crtcPropertyId = uVar39;
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((QKmsPlane *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
          == (this->super_QArrayDataPointer<QKmsPlane>).ptr)) goto LAB_001158dc;
      pQVar8 = (this->super_QArrayDataPointer<QKmsPlane>).ptr;
      pQVar8[-1].possibleCrtcs = args->possibleCrtcs;
      TVar24 = args->type;
      pQVar8[-1].id = args->id;
      pQVar8[-1].type = TVar24;
      pDVar5 = (args->supportedFormats).d.d;
      pQVar8[-1].supportedFormats.d.d = pDVar5;
      pQVar8[-1].supportedFormats.d.ptr = (args->supportedFormats).d.ptr;
      pQVar8[-1].supportedFormats.d.size = (args->supportedFormats).d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      RVar36.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
      super_QFlagsStorage<QKmsPlane::Rotation>.i =
           (args->initialRotation).super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>;
      RVar37.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
      super_QFlagsStorage<QKmsPlane::Rotation>.i =
           (args->availableRotations).super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>;
      uVar38 = args->rotationPropertyId;
      uVar39 = args->crtcPropertyId;
      uVar32 = args->framebufferPropertyId;
      uVar33 = args->srcXPropertyId;
      uVar34 = args->srcYPropertyId;
      uVar35 = args->crtcXPropertyId;
      uVar28 = args->crtcYPropertyId;
      uVar29 = args->srcwidthPropertyId;
      uVar30 = args->srcheightPropertyId;
      uVar31 = args->crtcwidthPropertyId;
      uVar25 = args->zposPropertyId;
      uVar26 = args->blendOpPropertyId;
      uVar27 = args->activeCrtcId;
      pQVar8[-1].crtcheightPropertyId = args->crtcheightPropertyId;
      pQVar8[-1].zposPropertyId = uVar25;
      pQVar8[-1].blendOpPropertyId = uVar26;
      pQVar8[-1].activeCrtcId = uVar27;
      pQVar8[-1].crtcYPropertyId = uVar28;
      pQVar8[-1].srcwidthPropertyId = uVar29;
      pQVar8[-1].srcheightPropertyId = uVar30;
      pQVar8[-1].crtcwidthPropertyId = uVar31;
      pQVar8[-1].framebufferPropertyId = uVar32;
      pQVar8[-1].srcXPropertyId = uVar33;
      pQVar8[-1].srcYPropertyId = uVar34;
      pQVar8[-1].crtcXPropertyId = uVar35;
      pQVar8[-1].initialRotation =
           (Rotations)
           RVar36.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
           super_QFlagsStorage<QKmsPlane::Rotation>.i;
      pQVar8[-1].availableRotations =
           (Rotations)
           RVar37.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
           super_QFlagsStorage<QKmsPlane::Rotation>.i;
      pQVar8[-1].rotationPropertyId = uVar38;
      pQVar8[-1].crtcPropertyId = uVar39;
      ppQVar1 = &(this->super_QArrayDataPointer<QKmsPlane>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QKmsPlane>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }